

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion.cpp
# Opt level: O1

double __thiscall
icu_63::double_conversion::StringToDoubleConverter::StringToIeee<char_const*>
          (StringToDoubleConverter *this,char *input,int length,bool read_as_double,
          int *processed_characters_count)

{
  double_conversion *pdVar1;
  double_conversion dVar2;
  double dVar3;
  int *piVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  double_conversion dVar8;
  int iVar9;
  int iVar10;
  undefined7 in_register_00000009;
  int iVar11;
  long lVar12;
  byte bVar13;
  double_conversion *pdVar14;
  long lVar15;
  uint uVar16;
  double_conversion *pdVar17;
  long lVar18;
  byte bVar19;
  uint uVar20;
  int iVar21;
  char cVar22;
  undefined4 in_XMM0_Da;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  float fVar23;
  undefined4 in_XMM0_Db;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  Vector<const_char> buffer_00;
  Vector<const_char> buffer_01;
  bool result_is_junk_1;
  char *start;
  char buffer [782];
  double_conversion *local_3a8;
  uint local_39c;
  int *local_398;
  double_conversion *local_390;
  char *local_388;
  double_conversion *local_380;
  int local_378;
  bool local_371;
  double_conversion *local_370;
  undefined1 local_368 [16];
  double_conversion *local_358;
  double_conversion *local_350;
  double_conversion local_348 [792];
  
  *processed_characters_count = 0;
  if (length == 0) {
LAB_00251557:
    return this->empty_string_value_;
  }
  local_368._0_4_ = (int)CONCAT71(in_register_00000009,read_as_double);
  lVar12 = (long)length;
  local_390 = (double_conversion *)(input + lVar12);
  uVar20 = this->flags_;
  local_3a8 = (double_conversion *)input;
  if ((uVar20 & 0x18) != 0) {
    bVar6 = isWhitespace((int)*input);
    in_XMM0_Da = extraout_XMM0_Da;
    in_XMM0_Db = extraout_XMM0_Db;
    if (bVar6) {
      local_398 = (int *)CONCAT44(local_398._4_4_,uVar20);
      pdVar17 = (double_conversion *)input;
      do {
        lVar12 = lVar12 + -1;
        if (lVar12 == 0) {
          local_3a8 = local_390;
          goto LAB_0025154e;
        }
        pdVar17 = pdVar17 + 1;
        bVar6 = isWhitespace((int)(char)*pdVar17);
      } while (bVar6);
      in_XMM0_Da = extraout_XMM0_Da_00;
      in_XMM0_Db = extraout_XMM0_Db_00;
      uVar20 = (uint)local_398;
      local_3a8 = pdVar17;
      if (lVar12 == 0) {
LAB_0025154e:
        *processed_characters_count = (int)local_3a8 - (int)input;
        goto LAB_00251557;
      }
    }
    if (((uVar20 & 8) == 0) && (local_3a8 != (double_conversion *)input)) goto LAB_00251482;
  }
  pdVar17 = local_3a8;
  dVar2 = *local_3a8;
  bVar19 = (byte)uVar20;
  local_398 = processed_characters_count;
  local_388 = input;
  if ((dVar2 == (double_conversion)0x2d) || (dVar2 == (double_conversion)0x2b)) {
    local_39c = (uint)(dVar2 == (double_conversion)0x2d);
    pdVar14 = local_3a8 + 1;
    bVar6 = pdVar14 != local_390;
    lVar12 = 1;
    if ((bVar6) &&
       (pdVar1 = local_3a8 + 1, local_3a8 = pdVar14, bVar7 = isWhitespace((int)(char)*pdVar1),
       in_XMM0_Da = extraout_XMM0_Da_01, in_XMM0_Db = extraout_XMM0_Db_01, pdVar14 = local_3a8,
       bVar7)) {
      lVar15 = (long)local_390 - (long)pdVar17;
      lVar18 = 2;
      do {
        bVar6 = pdVar17 + lVar18 != local_390;
        lVar12 = lVar15;
        pdVar14 = local_3a8;
        if (pdVar17 + lVar18 == local_390) break;
        bVar7 = isWhitespace((int)(char)pdVar17[lVar18]);
        lVar12 = lVar18;
        lVar18 = lVar18 + 1;
        in_XMM0_Da = extraout_XMM0_Da_02;
        in_XMM0_Db = extraout_XMM0_Db_02;
        pdVar14 = local_3a8;
      } while (bVar7);
    }
    local_3a8 = pdVar14;
    if ((bVar6) && (((uVar20 & 0x20) != 0 || (lVar12 == 1)))) {
      local_3a8 = pdVar17 + lVar12;
      bVar6 = true;
    }
    else {
      in_XMM0_Da = SUB84(this->junk_string_value_,0);
      in_XMM0_Db = (undefined4)((ulong)this->junk_string_value_ >> 0x20);
      bVar6 = false;
    }
    if (!bVar6) {
      return (double)CONCAT44(in_XMM0_Db,in_XMM0_Da);
    }
  }
  else {
    local_39c = 0;
  }
  pdVar14 = local_390;
  piVar4 = local_398;
  pdVar17 = (double_conversion *)this->infinity_symbol_;
  if ((pdVar17 == (double_conversion *)0x0) || (*local_3a8 != *pdVar17)) {
    pdVar17 = (double_conversion *)this->nan_symbol_;
    if ((pdVar17 == (double_conversion *)0x0) || (*local_3a8 != *pdVar17)) {
      dVar2 = *local_3a8;
      iVar9 = 0;
      bVar13 = 0;
      if (dVar2 != (double_conversion)0x30) {
LAB_00251637:
        iVar21 = 0;
        bVar6 = false;
        uVar16 = 0;
        do {
          dVar8 = *local_3a8;
          if (9 < (byte)((char)dVar8 - 0x30U)) {
            if (iVar9 == 0) {
              bVar13 = 0;
            }
            iVar11 = 0;
            if (dVar8 != (double_conversion)0x2e) goto LAB_00251b01;
            if (((~bVar13 | bVar19 >> 2) & 1) == 0) goto LAB_00251482;
            iVar11 = 0;
            pdVar17 = local_3a8;
            if ((bVar13 & 1) != 0) goto LAB_0025169e;
            pdVar17 = local_3a8 + 1;
            if (pdVar17 == local_390) {
              iVar11 = 0;
              if ((iVar9 != 0) || (dVar2 == (double_conversion)0x30)) goto LAB_0025169e;
              goto LAB_00251482;
            }
            iVar11 = 0;
            local_3a8 = pdVar17;
            if ((iVar9 != 0) || (iVar11 = 0, *pdVar17 != (double_conversion)0x30))
            goto LAB_0025189b;
            iVar11 = 0;
            goto LAB_00251876;
          }
          if (iVar9 < 0x304) {
            lVar12 = (long)(int)uVar16;
            uVar16 = uVar16 + 1;
            local_348[lVar12] = dVar8;
            iVar9 = iVar9 + 1;
          }
          else {
            iVar21 = iVar21 + 1;
            bVar6 = (bool)(dVar8 != (double_conversion)0x30 | bVar6);
          }
          if ((bVar13 & 1) == 0) {
            bVar13 = false;
          }
          else {
            bVar13 = (char)*local_3a8 < '8';
          }
          local_3a8 = local_3a8 + 1;
        } while (local_3a8 != local_390);
        iVar11 = 0;
        pdVar17 = local_3a8;
        goto LAB_0025169e;
      }
      pdVar17 = local_3a8 + 1;
      if (pdVar17 == local_390) {
        *local_398 = (int)pdVar17 - (int)local_388;
      }
      else {
        if (((uVar20 & 1) != 0) && (((byte)*pdVar17 | 0x20) == 0x78)) {
          local_3a8 = local_3a8 + 2;
          if ((local_3a8 != local_390) &&
             ((dVar2 = *local_3a8, (char)dVar2 < 0x40 && (int)(char)dVar2 - 0x30U < 10 ||
              (((byte)dVar2 - 0x41 < 0x26 &&
               ((0x3f0000003fU >> ((ulong)((byte)dVar2 - 0x41) & 0x3f) & 1) != 0)))))) {
            local_368._0_8_ =
                 RadixStringToIeee<4,char_const*>
                           ((char **)&local_3a8,(char *)local_390,(bool)(char)local_39c,
                            SUB41((uVar20 & 4) >> 2,0),this->junk_string_value_,local_368[0],
                            (bool *)local_348);
            pdVar17 = local_3a8;
            if (local_348[0] != (double_conversion)0x0) {
              return (double)local_368._0_8_;
            }
            if (local_3a8 != pdVar14 && (uVar20 & 0x10) != 0) {
              local_368._8_4_ = extraout_XMM0_Dc;
              local_368._12_4_ = extraout_XMM0_Dd;
              bVar6 = isWhitespace((int)(char)*local_3a8);
              if (bVar6) {
                do {
                  pdVar17 = pdVar17 + 1;
                  if (pdVar17 == local_390) break;
                  bVar6 = isWhitespace((int)(char)*pdVar17);
                } while (bVar6);
              }
            }
            local_3a8 = pdVar17;
            *piVar4 = (int)local_3a8 - (int)local_388;
            return (double)local_368._0_8_;
          }
          goto LAB_00251482;
        }
        iVar21 = (int)pdVar17 - (int)local_388;
        do {
          if (*pdVar17 != (double_conversion)0x30) {
            bVar13 = bVar19 >> 1;
            local_3a8 = pdVar17;
            goto LAB_00251637;
          }
          pdVar17 = pdVar17 + 1;
          iVar21 = iVar21 + 1;
        } while (pdVar17 != local_390);
        *local_398 = iVar21;
      }
LAB_002519ec:
      if ((bool)(char)local_39c == false) {
        return 0.0;
      }
      return -0.0;
    }
    do {
      pdVar14 = local_3a8 + 1;
      pdVar17 = pdVar17 + 1;
      dVar2 = *pdVar17;
      local_3a8 = pdVar14;
      if (dVar2 == (double_conversion)0x0) goto LAB_00251a03;
    } while ((pdVar14 != local_390) && (*pdVar14 == dVar2));
    if (dVar2 == (double_conversion)0x0) {
LAB_00251a03:
      if (pdVar14 == local_390 || (uVar20 & 0x14) != 0) {
        if ((uVar20 & 4) == 0) {
          bVar6 = pdVar14 != local_390;
          if ((bVar6) && (bVar7 = isWhitespace((int)(char)*pdVar14), bVar7)) {
            do {
              pdVar14 = pdVar14 + 1;
              bVar6 = pdVar14 != local_390;
              if (pdVar14 == local_390) break;
              bVar7 = isWhitespace((int)(char)*pdVar14);
            } while (bVar7);
          }
          local_3a8 = pdVar14;
          if (bVar6) goto LAB_00251482;
        }
        *local_398 = (int)local_3a8 - (int)local_388;
        if ((char)local_39c == '\0') {
          return NAN;
        }
        return -NAN;
      }
    }
  }
  else {
    do {
      pdVar14 = local_3a8 + 1;
      pdVar17 = pdVar17 + 1;
      dVar2 = *pdVar17;
      local_3a8 = pdVar14;
      if (dVar2 == (double_conversion)0x0) goto LAB_002518ea;
    } while ((pdVar14 != local_390) && (*pdVar14 == dVar2));
    if (dVar2 == (double_conversion)0x0) {
LAB_002518ea:
      if (pdVar14 == local_390 || (uVar20 & 0x14) != 0) {
        if ((uVar20 & 4) == 0) {
          bVar6 = pdVar14 != local_390;
          if ((bVar6) && (bVar7 = isWhitespace((int)(char)*pdVar14), bVar7)) {
            do {
              pdVar14 = pdVar14 + 1;
              bVar6 = pdVar14 != local_390;
              if (pdVar14 == local_390) break;
              bVar7 = isWhitespace((int)(char)*pdVar14);
            } while (bVar7);
          }
          local_3a8 = pdVar14;
          if (bVar6) goto LAB_00251482;
        }
        *local_398 = (int)local_3a8 - (int)local_388;
        if ((char)local_39c == '\0') {
          return INFINITY;
        }
        return -INFINITY;
      }
    }
  }
  goto LAB_00251482;
  while (iVar11 = iVar11 + -1, *local_3a8 == (double_conversion)0x30) {
LAB_00251876:
    local_3a8 = local_3a8 + 1;
    if (local_3a8 == local_390) {
      *local_398 = (((int)pdVar17 - (int)local_388) - iVar11) + 1;
      goto LAB_002519ec;
    }
  }
LAB_0025189b:
  do {
    dVar8 = *local_3a8;
    if (9 < (byte)((char)dVar8 - 0x30U)) goto LAB_00251b01;
    if (iVar9 < 0x304) {
      lVar12 = (long)(int)uVar16;
      uVar16 = uVar16 + 1;
      local_348[lVar12] = dVar8;
      iVar9 = iVar9 + 1;
      iVar11 = iVar11 + -1;
    }
    else {
      bVar6 = (bool)(dVar8 != (double_conversion)0x30 | bVar6);
    }
    local_3a8 = local_3a8 + 1;
    pdVar17 = local_3a8;
  } while (local_3a8 != local_390);
  goto LAB_0025169e;
LAB_00251b01:
  if ((iVar9 == 0 && iVar11 == 0) && dVar2 != (double_conversion)0x30) goto LAB_00251482;
  if (((byte)*local_3a8 | 0x20) == 0x65) {
    if (((~bVar13 | bVar19 >> 2) & 1) == 0) goto LAB_00251482;
    pdVar17 = local_3a8;
    if ((bVar13 & 1) != 0) goto LAB_0025169e;
    pdVar17 = local_3a8 + 1;
    if (pdVar17 == local_390) {
      if ((uVar20 & 4) == 0) goto LAB_00251482;
      goto LAB_0025169e;
    }
    dVar2 = *pdVar17;
    if ((((dVar2 == (double_conversion)0x2d) ||
         (dVar8 = (double_conversion)0x2b, dVar2 == (double_conversion)0x2b)) &&
        (local_3a8 = local_3a8 + 2, pdVar17 = local_3a8, dVar8 = dVar2, local_3a8 == local_390)) ||
       ((local_3a8 = pdVar17, local_3a8 == local_390 || ((byte)((char)*local_3a8 - 0x3aU) < 0xf6))))
    {
      iVar9 = 6;
      if ((uVar20 & 4) == 0) {
        in_XMM0_Da = SUB84(this->junk_string_value_,0);
        in_XMM0_Db = (undefined4)((ulong)this->junk_string_value_ >> 0x20);
        iVar9 = 1;
      }
    }
    else {
      iVar9 = 0;
      pdVar17 = local_3a8;
      do {
        local_3a8 = pdVar17 + 1;
        if ((iVar9 < 0x6666666) ||
           ((iVar10 = 0x3fffffff, iVar9 == 0x6666666 && ((char)*pdVar17 < '4')))) {
          iVar10 = (int)(char)*pdVar17 + iVar9 * 10 + -0x30;
        }
        iVar9 = iVar10;
      } while ((local_3a8 != local_390) &&
              (pdVar17 = local_3a8, (byte)((char)*local_3a8 - 0x30U) < 10));
      iVar10 = -iVar9;
      if (dVar8 != (double_conversion)0x2d) {
        iVar10 = iVar9;
      }
      iVar11 = iVar11 + iVar10;
      iVar9 = 0;
    }
    pdVar17 = local_3a8;
    if (iVar9 == 6) goto LAB_0025169e;
    if (iVar9 != 0) {
      return (double)CONCAT44(in_XMM0_Db,in_XMM0_Da);
    }
  }
  if (local_3a8 == local_390 || (uVar20 & 0x14) != 0) {
    local_378 = iVar11;
    if ((uVar20 & 4) == 0) {
      cVar22 = local_3a8 != local_390;
      if ((bool)cVar22) {
        local_370 = (double_conversion *)CONCAT71(local_370._1_7_,cVar22);
        local_380 = local_3a8;
        local_358 = local_3a8;
        bVar7 = isWhitespace((int)(char)*local_3a8);
        pdVar14 = local_380;
        pdVar17 = local_358;
        if (bVar7) {
          do {
            pdVar14 = pdVar17 + 1;
            local_370 = (double_conversion *)CONCAT71(local_370._1_7_,pdVar14 != local_390);
            if (pdVar14 == local_390) break;
            local_380 = pdVar14;
            bVar7 = isWhitespace((int)(char)*pdVar14);
            pdVar14 = local_380;
            pdVar17 = local_380;
          } while (bVar7);
        }
        cVar22 = (char)local_370;
        local_3a8 = pdVar14;
      }
      if (cVar22 != '\0') goto LAB_00251482;
    }
    iVar11 = local_378;
    pdVar17 = local_3a8;
    if (local_3a8 != local_390 && (uVar20 & 0x10) != 0) {
      local_380 = local_3a8;
      local_370 = local_3a8;
      bVar7 = isWhitespace((int)(char)*local_3a8);
      iVar11 = local_378;
      pdVar14 = local_370;
      pdVar17 = local_380;
      if (bVar7) {
        do {
          pdVar17 = pdVar14 + 1;
          iVar11 = local_378;
          if (pdVar17 == local_390) break;
          local_380 = pdVar17;
          bVar7 = isWhitespace((int)(char)*pdVar17);
          iVar11 = local_378;
          pdVar14 = local_380;
          pdVar17 = local_380;
        } while (bVar7);
      }
    }
LAB_0025169e:
    local_3a8 = pdVar17;
    piVar4 = local_398;
    bVar7 = (bool)(char)local_39c;
    bVar5 = local_368[0];
    if ((bVar13 & 1) != 0) {
      local_350 = local_348;
      dVar3 = RadixStringToIeee<3,char*>
                        ((char **)&local_350,(char *)(local_348 + (int)uVar16),(bool)(char)local_39c
                         ,SUB41((uVar20 & 4) >> 2,0),this->junk_string_value_,local_368[0],
                         &local_371);
      *local_398 = (int)local_3a8 - (int)local_388;
      return dVar3;
    }
    iVar11 = iVar11 + iVar21;
    if (bVar6) {
      lVar12 = (long)(int)uVar16;
      uVar16 = uVar16 + 1;
      local_348[lVar12] = (double_conversion)0x31;
      iVar11 = iVar11 + -1;
    }
    local_348[(int)uVar16] = (double_conversion)0x0;
    buffer_00.start_ = (ulong)uVar16;
    if (bVar5 == false) {
      buffer_01.length_ = iVar11;
      buffer_01.start_ = (char *)buffer_00.start_;
      buffer_01._12_4_ = 0;
      fVar23 = Strtof(local_348,buffer_01,local_368._0_4_);
      dVar3 = (double)fVar23;
    }
    else {
      buffer_00.length_ = iVar11;
      buffer_00._12_4_ = 0;
      dVar3 = Strtod(local_348,buffer_00,local_368._0_4_);
    }
    *piVar4 = (int)local_3a8 - (int)local_388;
    if (bVar7 == false) {
      return dVar3;
    }
    return -dVar3;
  }
LAB_00251482:
  return this->junk_string_value_;
}

Assistant:

double StringToDoubleConverter::StringToIeee(
    Iterator input,
    int length,
    bool read_as_double,
    int* processed_characters_count) const {
  Iterator current = input;
  Iterator end = input + length;

  *processed_characters_count = 0;

  const bool allow_trailing_junk = (flags_ & ALLOW_TRAILING_JUNK) != 0;
  const bool allow_leading_spaces = (flags_ & ALLOW_LEADING_SPACES) != 0;
  const bool allow_trailing_spaces = (flags_ & ALLOW_TRAILING_SPACES) != 0;
  const bool allow_spaces_after_sign = (flags_ & ALLOW_SPACES_AFTER_SIGN) != 0;

  // To make sure that iterator dereferencing is valid the following
  // convention is used:
  // 1. Each '++current' statement is followed by check for equality to 'end'.
  // 2. If AdvanceToNonspace returned false then current == end.
  // 3. If 'current' becomes equal to 'end' the function returns or goes to
  // 'parsing_done'.
  // 4. 'current' is not dereferenced after the 'parsing_done' label.
  // 5. Code before 'parsing_done' may rely on 'current != end'.
  if (current == end) return empty_string_value_;

  if (allow_leading_spaces || allow_trailing_spaces) {
    if (!AdvanceToNonspace(&current, end)) {
      *processed_characters_count = static_cast<int>(current - input);
      return empty_string_value_;
    }
    if (!allow_leading_spaces && (input != current)) {
      // No leading spaces allowed, but AdvanceToNonspace moved forward.
      return junk_string_value_;
    }
  }

  // The longest form of simplified number is: "-<significant digits>.1eXXX\0".
  const int kBufferSize = kMaxSignificantDigits + 10;
  char buffer[kBufferSize];  // NOLINT: size is known at compile time.
  int buffer_pos = 0;

  // Exponent will be adjusted if insignificant digits of the integer part
  // or insignificant leading zeros of the fractional part are dropped.
  int exponent = 0;
  int significant_digits = 0;
  int insignificant_digits = 0;
  bool nonzero_digit_dropped = false;

  bool sign = false;

  if (*current == '+' || *current == '-') {
    sign = (*current == '-');
    ++current;
    Iterator next_non_space = current;
    // Skip following spaces (if allowed).
    if (!AdvanceToNonspace(&next_non_space, end)) return junk_string_value_;
    if (!allow_spaces_after_sign && (current != next_non_space)) {
      return junk_string_value_;
    }
    current = next_non_space;
  }

  if (infinity_symbol_ != NULL) {
    if (*current == infinity_symbol_[0]) {
      if (!ConsumeSubString(&current, end, infinity_symbol_)) {
        return junk_string_value_;
      }

      if (!(allow_trailing_spaces || allow_trailing_junk) && (current != end)) {
        return junk_string_value_;
      }
      if (!allow_trailing_junk && AdvanceToNonspace(&current, end)) {
        return junk_string_value_;
      }

      ASSERT(buffer_pos == 0);
      *processed_characters_count = static_cast<int>(current - input);
      return sign ? -Double::Infinity() : Double::Infinity();
    }
  }

  if (nan_symbol_ != NULL) {
    if (*current == nan_symbol_[0]) {
      if (!ConsumeSubString(&current, end, nan_symbol_)) {
        return junk_string_value_;
      }

      if (!(allow_trailing_spaces || allow_trailing_junk) && (current != end)) {
        return junk_string_value_;
      }
      if (!allow_trailing_junk && AdvanceToNonspace(&current, end)) {
        return junk_string_value_;
      }

      ASSERT(buffer_pos == 0);
      *processed_characters_count = static_cast<int>(current - input);
      return sign ? -Double::NaN() : Double::NaN();
    }
  }

  bool leading_zero = false;
  if (*current == '0') {
    ++current;
    if (current == end) {
      *processed_characters_count = static_cast<int>(current - input);
      return SignedZero(sign);
    }

    leading_zero = true;

    // It could be hexadecimal value.
    if ((flags_ & ALLOW_HEX) && (*current == 'x' || *current == 'X')) {
      ++current;
      if (current == end || !isDigit(*current, 16)) {
        return junk_string_value_;  // "0x".
      }

      bool result_is_junk;
      double result = RadixStringToIeee<4>(&current,
                                           end,
                                           sign,
                                           allow_trailing_junk,
                                           junk_string_value_,
                                           read_as_double,
                                           &result_is_junk);
      if (!result_is_junk) {
        if (allow_trailing_spaces) AdvanceToNonspace(&current, end);
        *processed_characters_count = static_cast<int>(current - input);
      }
      return result;
    }

    // Ignore leading zeros in the integer part.
    while (*current == '0') {
      ++current;
      if (current == end) {
        *processed_characters_count = static_cast<int>(current - input);
        return SignedZero(sign);
      }
    }
  }

  bool octal = leading_zero && (flags_ & ALLOW_OCTALS) != 0;

  // Copy significant digits of the integer part (if any) to the buffer.
  while (*current >= '0' && *current <= '9') {
    if (significant_digits < kMaxSignificantDigits) {
      ASSERT(buffer_pos < kBufferSize);
      buffer[buffer_pos++] = static_cast<char>(*current);
      significant_digits++;
      // Will later check if it's an octal in the buffer.
    } else {
      insignificant_digits++;  // Move the digit into the exponential part.
      nonzero_digit_dropped = nonzero_digit_dropped || *current != '0';
    }
    octal = octal && *current < '8';
    ++current;
    if (current == end) goto parsing_done;
  }

  if (significant_digits == 0) {
    octal = false;
  }

  if (*current == '.') {
    if (octal && !allow_trailing_junk) return junk_string_value_;
    if (octal) goto parsing_done;

    ++current;
    if (current == end) {
      if (significant_digits == 0 && !leading_zero) {
        return junk_string_value_;
      } else {
        goto parsing_done;
      }
    }

    if (significant_digits == 0) {
      // octal = false;
      // Integer part consists of 0 or is absent. Significant digits start after
      // leading zeros (if any).
      while (*current == '0') {
        ++current;
        if (current == end) {
          *processed_characters_count = static_cast<int>(current - input);
          return SignedZero(sign);
        }
        exponent--;  // Move this 0 into the exponent.
      }
    }

    // There is a fractional part.
    // We don't emit a '.', but adjust the exponent instead.
    while (*current >= '0' && *current <= '9') {
      if (significant_digits < kMaxSignificantDigits) {
        ASSERT(buffer_pos < kBufferSize);
        buffer[buffer_pos++] = static_cast<char>(*current);
        significant_digits++;
        exponent--;
      } else {
        // Ignore insignificant digits in the fractional part.
        nonzero_digit_dropped = nonzero_digit_dropped || *current != '0';
      }
      ++current;
      if (current == end) goto parsing_done;
    }
  }

  if (!leading_zero && exponent == 0 && significant_digits == 0) {
    // If leading_zeros is true then the string contains zeros.
    // If exponent < 0 then string was [+-]\.0*...
    // If significant_digits != 0 the string is not equal to 0.
    // Otherwise there are no digits in the string.
    return junk_string_value_;
  }

  // Parse exponential part.
  if (*current == 'e' || *current == 'E') {
    if (octal && !allow_trailing_junk) return junk_string_value_;
    if (octal) goto parsing_done;
    ++current;
    if (current == end) {
      if (allow_trailing_junk) {
        goto parsing_done;
      } else {
        return junk_string_value_;
      }
    }
    char exponen_sign = '+';
    if (*current == '+' || *current == '-') {
      exponen_sign = static_cast<char>(*current);
      ++current;
      if (current == end) {
        if (allow_trailing_junk) {
          goto parsing_done;
        } else {
          return junk_string_value_;
        }
      }
    }

    if (current == end || *current < '0' || *current > '9') {
      if (allow_trailing_junk) {
        goto parsing_done;
      } else {
        return junk_string_value_;
      }
    }

    const int max_exponent = INT_MAX / 2;
    ASSERT(-max_exponent / 2 <= exponent && exponent <= max_exponent / 2);
    int num = 0;
    do {
      // Check overflow.
      int digit = *current - '0';
      if (num >= max_exponent / 10
          && !(num == max_exponent / 10 && digit <= max_exponent % 10)) {
        num = max_exponent;
      } else {
        num = num * 10 + digit;
      }
      ++current;
    } while (current != end && *current >= '0' && *current <= '9');

    exponent += (exponen_sign == '-' ? -num : num);
  }

  if (!(allow_trailing_spaces || allow_trailing_junk) && (current != end)) {
    return junk_string_value_;
  }
  if (!allow_trailing_junk && AdvanceToNonspace(&current, end)) {
    return junk_string_value_;
  }
  if (allow_trailing_spaces) {
    AdvanceToNonspace(&current, end);
  }

  parsing_done:
  exponent += insignificant_digits;

  if (octal) {
    double result;
    bool result_is_junk;
    char* start = buffer;
    result = RadixStringToIeee<3>(&start,
                                  buffer + buffer_pos,
                                  sign,
                                  allow_trailing_junk,
                                  junk_string_value_,
                                  read_as_double,
                                  &result_is_junk);
    ASSERT(!result_is_junk);
    *processed_characters_count = static_cast<int>(current - input);
    return result;
  }

  if (nonzero_digit_dropped) {
    buffer[buffer_pos++] = '1';
    exponent--;
  }

  ASSERT(buffer_pos < kBufferSize);
  buffer[buffer_pos] = '\0';

  double converted;
  if (read_as_double) {
    converted = Strtod(Vector<const char>(buffer, buffer_pos), exponent);
  } else {
    converted = Strtof(Vector<const char>(buffer, buffer_pos), exponent);
  }
  *processed_characters_count = static_cast<int>(current - input);
  return sign? -converted: converted;
}